

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int cpool_find_conn(Curl_easy *data,connectdata *conn,void *param)

{
  bool bVar1;
  cpool_find_ctx *fctx;
  void *param_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bVar1 = conn->connection_id == *param;
  if (bVar1) {
    *(connectdata **)((long)param + 8) = conn;
  }
  data_local._4_4_ = (uint)bVar1;
  return data_local._4_4_;
}

Assistant:

static int cpool_find_conn(struct Curl_easy *data,
                           struct connectdata *conn, void *param)
{
  struct cpool_find_ctx *fctx = param;
  (void)data;
  if(conn->connection_id == fctx->id) {
    fctx->conn = conn;
    return 1;
  }
  return 0;
}